

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON_Font * __thiscall ON_DimStyle::ParentDimStyleFont(ON_DimStyle *this)

{
  bool bVar1;
  ON_UUID *b;
  ON_Font *pOVar2;
  ON_DimStyle *this_local;
  
  if (this->m_parent_dimstyle_managed_font != (ON_Font *)0x0) {
    b = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
    bVar1 = ::operator==(&ON_nil_uuid,b);
    if ((!bVar1) && (bVar1 = IsFieldOverride(this,Font), bVar1)) {
      return this->m_parent_dimstyle_managed_font;
    }
  }
  pOVar2 = Font(this);
  return pOVar2;
}

Assistant:

const ON_Font& ON_DimStyle::ParentDimStyleFont() const
{
  // If this dimstyle has a parent dimstyle and this dimstyle's font overrides the parent dimstyle's font,
  // then the parent dimstyle's font is returned. Otherwise this dimstyle's font is returned.
  return
    (nullptr != m_parent_dimstyle_managed_font && false == (ON_nil_uuid == ParentId()) && IsFieldOverride(ON_DimStyle::field::Font) ) 
    ? *m_parent_dimstyle_managed_font 
    : Font();
}